

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-0.c
# Opt level: O2

int checkerBig1(void)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar2;
  int n;
  
  n = (int)((ulong)in_RAX >> 0x20);
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar1 = -1;
    goto LAB_0010276e;
  }
  pcVar2 = ScanInt((FILE *)__stream,&n);
  if (pcVar2 == "PASSED") {
    if (n != 0x17) {
      printf("wrong output -- ");
      goto LAB_00102757;
    }
    iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar1 == 0) {
      puts("PASSED");
      iVar1 = 0;
      goto LAB_0010276e;
    }
  }
  else {
LAB_00102757:
    fclose(__stream);
  }
  puts("FAILED");
  iVar1 = 1;
LAB_0010276e:
  testN = testN + 1;
  return iVar1;
}

Assistant:

static int checkerBig1(void)
{
  FILE *const out = fopen("out.txt", "r");
  int passed = 1;
  if (!out) {
    printf("can't open out.txt\n");
    testN++;
    return -1;
  }
  {
    int n;
    if (ScanInt(out, &n) != Pass) {
      passed = 0;
    } else if (23 != n) {
      passed = 0;
      printf("wrong output -- ");
    }
  }
  if (passed) {
    passed = !HaveGarbageAtTheEnd(out);
  }
  fclose(out);
  if (passed) {
    printf("PASSED\n");
    testN++;
    return 0;
  } else {
    printf("FAILED\n");
    testN++;
    return 1;
  }
}